

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O3

void __thiscall helics::FederateState::processLoggingMessage(FederateState *this,ActionMessage *cmd)

{
  SmallBuffer *this_00;
  ushort uVar1;
  action_t aVar2;
  uint uVar3;
  size_t sVar4;
  uint __val;
  uint uVar5;
  string *psVar6;
  uint uVar7;
  _Alloc_hider _Var8;
  ulong uVar9;
  int level;
  size_t sVar11;
  uint __len;
  bool fromRemote;
  string_view query;
  string_view logMessageSource;
  string_view logMessageSource_00;
  string_view message;
  string_view message_00;
  string qres;
  byte *st1;
  int in_stack_ffffffffffffff9c;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  size_type sVar10;
  byte *pbVar12;
  
  aVar2 = cmd->messageAction;
  if (aVar2 < cmd_timeout_disconnect) {
    if (aVar2 != cmd_log) {
      if (aVar2 != cmd_set_profiler_flag) {
        return;
      }
      uVar1 = cmd->flags;
      if (((uVar1 & 0x20) != 0) && (this->mProfilerActive == false)) {
        generateProfilingMarker(this);
      }
      this->mProfilerActive = SUB41((uVar1 & 0x20) >> 5,0);
      return;
    }
  }
  else {
    if (aVar2 == cmd_timeout_disconnect) {
      query._M_str = "global_time_debugging";
      query._M_len = 0x15;
      processQueryActual_abi_cxx11_(&local_58,this,query);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58,0,0,
                 "TIME DEBUGGING::",0x10);
      logMessageSource._M_str = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
      logMessageSource._M_len = gHelicsEmptyStr_abi_cxx11_._M_string_length;
      message._M_str = local_58._M_dataplus._M_p;
      message._M_len = local_58._M_string_length;
      logMessage(this,3,logMessageSource,message,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p == &local_58.field_2) {
        return;
      }
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      return;
    }
    if (aVar2 == cmd_warning) {
      sVar11 = (cmd->payload).bufferSize;
      if (sVar11 == 0) {
        this_00 = &cmd->payload;
        local_58._M_dataplus._M_p = commandErrorString(in_stack_ffffffffffffff9c);
        SmallBuffer::operator=(this_00,(char **)&local_58);
        sVar11 = (cmd->payload).bufferSize;
        if ((sVar11 == 7) &&
           (pbVar12 = (cmd->payload).heap, sVar11 = 7,
           *(undefined4 *)(pbVar12 + 3) == 0x6e776f6e && *(undefined4 *)pbVar12 == 0x6e6b6e75)) {
          SmallBuffer::reserve(this_00,0xd);
          (cmd->payload).bufferSize = 0xd;
          pbVar12 = (cmd->payload).heap;
          pbVar12[0xb] = 0x65;
          pbVar12[0xc] = 0x3a;
          pbVar12[7] = 0x20;
          pbVar12[8] = 99;
          pbVar12[9] = 0x6f;
          pbVar12[10] = 100;
          uVar3 = cmd->messageID;
          __val = -uVar3;
          if (0 < (int)uVar3) {
            __val = uVar3;
          }
          __len = 1;
          if (9 < __val) {
            uVar9 = (ulong)__val;
            uVar5 = 4;
            do {
              __len = uVar5;
              uVar7 = (uint)uVar9;
              if (uVar7 < 100) {
                __len = __len - 2;
                goto LAB_00315a11;
              }
              if (uVar7 < 1000) {
                __len = __len - 1;
                goto LAB_00315a11;
              }
              if (uVar7 < 10000) goto LAB_00315a11;
              uVar9 = uVar9 / 10000;
              uVar5 = __len + 4;
            } while (99999 < uVar7);
            __len = __len + 1;
          }
LAB_00315a11:
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_58,(ulong)(-((int)uVar3 >> 0x1f) + __len),'-');
          CLI::std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_58._M_dataplus._M_p + (uint)-((int)uVar3 >> 0x1f),__len,__val);
          local_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_58._M_dataplus._M_p;
          sVar4 = (cmd->payload).bufferSize;
          sVar11 = sVar4 + local_58._M_string_length;
          SmallBuffer::reserve(this_00,sVar11);
          (cmd->payload).bufferSize = sVar11;
          memcpy((cmd->payload).heap + sVar4,local_38,local_58._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          sVar11 = (cmd->payload).bufferSize;
        }
      }
      pbVar12 = (cmd->payload).heap;
      fromRemote = false;
      level = 3;
      _Var8._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
      sVar10 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
      goto LAB_00315ad5;
    }
    if (aVar2 != cmd_remote_log) {
      return;
    }
  }
  level = cmd->messageID;
  psVar6 = ActionMessage::getString_abi_cxx11_(cmd,0);
  pbVar12 = (cmd->payload).heap;
  sVar11 = (cmd->payload).bufferSize;
  fromRemote = cmd->messageAction == cmd_remote_log;
  _Var8._M_p = (psVar6->_M_dataplus)._M_p;
  sVar10 = psVar6->_M_string_length;
LAB_00315ad5:
  logMessageSource_00._M_str = _Var8._M_p;
  logMessageSource_00._M_len = sVar10;
  message_00._M_str = (char *)pbVar12;
  message_00._M_len = sVar11;
  logMessage(this,level,logMessageSource_00,message_00,fromRemote);
  return;
}

Assistant:

void FederateState::processLoggingMessage(ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_LOG:
        case CMD_REMOTE_LOG:
            logMessage(cmd.messageID,
                       cmd.getString(0),
                       cmd.payload.to_string(),
                       cmd.action() == CMD_REMOTE_LOG);
            break;

        case CMD_WARNING:
            if (cmd.payload.empty()) {
                cmd.payload = commandErrorString(cmd.messageID);
                if (cmd.payload.to_string() == "unknown") {
                    cmd.payload.append(" code:");
                    cmd.payload.append(std::to_string(cmd.messageID));
                }
            }
            LOG_WARNING(cmd.payload.to_string());
            break;
        case CMD_SET_PROFILER_FLAG:
            setOptionFlag(defs::PROFILING, checkActionFlag(cmd, indicator_flag));
            break;
        case CMD_TIMEOUT_DISCONNECT: {
            auto qres = processQueryActual("global_time_debugging");
            qres.insert(0, "TIME DEBUGGING::");
            LOG_WARNING(qres);
        } break;
        default:
            break;
    }
}